

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  unsigned_long i_control_block;
  bool bVar1;
  void *i_user_storage;
  unsigned_long uVar2;
  unsigned_long uVar3;
  __int_type _Var4;
  uintptr_t uVar5;
  ControlBlock *pCVar6;
  long lVar7;
  unsigned_long next_ptr;
  ControlBlock *new_block;
  unsigned_long new_tail_offset;
  unsigned_long page_start;
  void *user_storage;
  unsigned_long new_tail;
  __int_type tail;
  size_t sStack_78;
  LfQueue_ProgressGuarantee guarantee;
  size_t i_alignment_local;
  size_t i_size_local;
  uintptr_t uStack_60;
  bool i_include_type_local;
  uintptr_t i_control_bits_local;
  LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  unsigned_long local_30;
  undefined4 local_28;
  undefined4 local_24;
  unsigned_long local_20;
  unsigned_long *local_18;
  LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *local_10;
  
  tail._4_4_ = LfQueue_Throwing;
  sStack_78 = i_alignment;
  i_alignment_local = i_size;
  i_size_local._7_1_ = i_include_type;
  uStack_60 = i_control_bits;
  i_control_bits_local = (uintptr_t)this;
  if ((i_control_bits & 0xfffffffffffffff8) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x7a);
  }
  bVar1 = is_power_of_2(sStack_78);
  if ((!bVar1) || (i_alignment_local % sStack_78 != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x7b);
  }
  if (sStack_78 < 8) {
    sStack_78 = 8;
    i_alignment_local = uint_upper_align<unsigned_long>(i_alignment_local,8);
  }
  local_44 = 5;
  ___b = this;
  local_48 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_44 - 1U < 2) {
    this_local = (LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
  }
  else if (local_44 == 5) {
    this_local = (LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
  }
  else {
    this_local = (LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
  }
  new_tail = (unsigned_long)this_local;
  do {
    while( true ) {
      if ((new_tail == 0) || (bVar1 = uint_is_aligned<unsigned_long>(new_tail,0x40), !bVar1)) {
        density_tests::detail::assert_failed<>
                  ("tail != 0 && uint_is_aligned(tail, s_alloc_granularity)",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                   ,0x89);
      }
      lVar7 = 8;
      if ((i_size_local._7_1_ & 1) != 0) {
        lVar7 = 0x10;
      }
      i_user_storage = (void *)uint_upper_align<unsigned_long>(new_tail + lVar7,sStack_78);
      uVar2 = uint_upper_align<unsigned_long>((long)i_user_storage + i_alignment_local,0x40);
      uVar3 = uint_lower_align<unsigned_long>(new_tail,0x10000);
      i_control_block = new_tail;
      if (0xffc0 < uVar2 - uVar3) break;
      local_18 = &new_tail;
      local_24 = 5;
      local_28 = 5;
      LOCK();
      _Var4 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
      local_31 = new_tail == _Var4;
      if ((bool)local_31) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
        _Var4 = new_tail;
      }
      UNLOCK();
      local_30 = uVar2;
      local_20 = uVar2;
      local_10 = this;
      if ((bool)local_31) {
        uVar5 = raw_atomic_load((uintptr_t *)new_tail,memory_order_seq_cst);
        if (uVar5 != 0) {
          density_tests::detail::assert_failed<>
                    ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                     ,0xab);
        }
        uVar5 = uVar2 + uStack_60;
        raw_atomic_store((uintptr_t *)i_control_block,uVar5,memory_order_seq_cst);
        pCVar6 = LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                 ::get_end_control_block((void *)i_control_block);
        if (pCVar6 <= i_control_block) {
          density_tests::detail::assert_failed<>
                    ("new_block < get_end_control_block(new_block)",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                     ,0xb0);
        }
        LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        ::Allocation::Allocation
                  (__return_storage_ptr__,(LfQueueControl *)i_control_block,uVar5,i_user_storage);
        return __return_storage_ptr__;
      }
      new_tail = _Var4;
      if (tail._4_4_ == LfQueue_WaitFree) {
        LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        ::Allocation::Allocation(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
    if (0xffb0 < i_alignment_local + (sStack_78 - 8)) {
      if ((tail._4_4_ != LfQueue_LockFree) && (tail._4_4_ != LfQueue_WaitFree)) {
        LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
                  (__return_storage_ptr__,
                   (LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                    *)this,uStack_60,i_alignment_local,sStack_78);
        return __return_storage_ptr__;
      }
      LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
      ::Allocation::Allocation(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    new_tail = page_overflow(this,tail._4_4_,new_tail);
  } while ((tail._4_4_ == LfQueue_Throwing) || (new_tail != 0));
  LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  ::Allocation::Allocation(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                /* Operations on m_tail are mostly relaxed, because the ordering is done when accessing
                    the member m_next of the control blocks. */
                auto tail = m_tail.load(mem_relaxed);
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != 0 && uint_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    auto new_tail =
                      tail + (i_include_type ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    new_tail                = uint_upper_align(new_tail, i_alignment);
                    auto const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + i_size, s_alloc_granularity);

                    // check for page overflow
                    auto const page_start = uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    auto const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* No page overflow occurs with the new tail we have computed. */
                        if (m_tail.compare_exchange_weak(tail, new_tail, mem_relaxed, mem_relaxed))
                        {
                            /* At this point this thread has truncated the queue, because it has allocated
                               an element, but the member m_next of its control point is still zeroed (the
                               initial content of a newly allocated page).
                               Other threads may still put elements, but they will be not visible to the consumers
                               until the next store is completed. This is one of the reasons why this class 
                               is not sequential consistent. 
                               
                               The next store is safe because the zeroed block is a barrier that consumers will
                               not get over, so this page can't be deallocated. If this block does not have the 
                               dead 'flag', the access to this page is safe until the element is committed or canceled. */

                            // initialize the control block
                            auto const new_block = reinterpret_cast<ControlBlock *>(tail);
                            DENSITY_ASSERT_INTERNAL(
                              raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                            auto const next_ptr = new_tail + i_control_bits;
                            raw_atomic_store(&new_block->m_next, next_ptr, mem_relaxed);

                            // successful
                            DENSITY_ASSERT_INTERNAL(new_block < get_end_control_block(new_block));
                            return {new_block, next_ptr, user_storage};
                        }
                        else
                        {
                            if (guarantee == LfQueue_WaitFree)
                            {
                                // don't retry
                                return Allocation{};
                            }
                        }
                    }
                    else if (
                      i_size + (i_alignment - min_alignment) <=
                      s_max_size_inpage) // if this allocation may fit in a page
                    {
                        tail = page_overflow(guarantee, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          i_control_bits, i_size, i_alignment);
                    }
                }
            }